

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

uint128 * __thiscall
pstore::sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128>::
bitmap<unsigned_long_const*,void>
          (uint128 *__return_storage_ptr__,
          sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128> *this,
          unsigned_long *first,unsigned_long *last)

{
  uint128 *puVar1;
  uint128 local_38;
  sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128> *local_28;
  unsigned_long *last_local;
  unsigned_long *first_local;
  
  local_28 = this;
  last_local = (unsigned_long *)__return_storage_ptr__;
  uint128::uint128<unsigned_int,void>(&local_38,0);
  puVar1 = std::
           accumulate<unsigned_long_const*,pstore::uint128,pstore::sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128>::bitmap<unsigned_long_const*,void>(unsigned_long_const*,unsigned_long_const*)::_lambda(pstore::uint128,unsigned_long)_1_>
                     (__return_storage_ptr__,this,(undefined8)local_38.v_,local_38.v_._8_8_);
  return puVar1;
}

Assistant:

BitmapType sparse_array<ValueType, BitmapType>::bitmap (InputIterator first,
                                                            InputIterator last) {
        return std::accumulate (
            first, last, BitmapType{0U},
            [] (BitmapType const mm, typename std::iterator_traits<InputIterator>::value_type const idx) {
                PSTORE_ASSERT (idx < max_size ());
                auto const mask = BitmapType{1U} << idx;
                PSTORE_ASSERT ((mm & mask) == 0U &&
                               "The same index must not appear more than once in the "
                               "collection of sparse indices");
                return static_cast<BitmapType> (mm | mask);
            });
    }